

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O1

uint32_t run_container_rank_many
                   (run_container_t *container,uint64_t start_rank,uint32_t *begin,uint32_t *end,
                   uint64_t *ans)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint32_t *puVar7;
  uint64_t uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint32_t *local_38;
  
  puVar7 = begin;
  if (begin != end) {
    uVar3 = *begin;
    iVar5 = 0;
    iVar6 = 0;
    local_38 = begin;
    do {
      uVar11 = *puVar7 ^ uVar3;
      if (uVar11 < 0x10000) {
        uVar9 = *puVar7 & 0xffff;
        iVar4 = container->n_runs;
        do {
          if (iVar4 <= iVar6) break;
          uVar1 = container->runs[iVar6].value;
          uVar2 = container->runs[iVar6].length;
          uVar10 = (uint)uVar2 + (uint)uVar1;
          if (uVar10 < uVar9) {
            iVar5 = iVar5 + (uint)uVar2 + 1;
            iVar6 = iVar6 + 1;
          }
          else {
            uVar8 = (long)iVar5 + start_rank;
            if (uVar1 <= uVar9) {
              uVar8 = (ulong)(uVar9 - uVar1) + start_rank + 1 + (long)iVar5;
            }
            *ans = uVar8;
            ans = ans + 1;
          }
        } while (uVar10 < uVar9);
        if (iVar4 <= iVar6) {
          *ans = (long)iVar5 + start_rank;
          ans = ans + 1;
        }
      }
      else {
        local_38 = (uint32_t *)((ulong)((long)puVar7 - (long)begin) >> 2);
      }
      if (0xffff < uVar11) {
        return (uint32_t)local_38;
      }
      puVar7 = puVar7 + 1;
    } while (puVar7 != end);
  }
  return (uint32_t)((ulong)((long)puVar7 - (long)begin) >> 2);
}

Assistant:

uint32_t run_container_rank_many(const run_container_t *container,
                                 uint64_t start_rank, const uint32_t *begin,
                                 const uint32_t *end, uint64_t *ans) {
    const uint16_t high = (uint16_t)((*begin) >> 16);
    const uint32_t *iter = begin;
    int sum = 0;
    int i = 0;
    for (; iter != end; iter++) {
        uint32_t x = *iter;
        uint16_t xhigh = (uint16_t)(x >> 16);
        if (xhigh != high) return iter - begin;  // stop at next container

        uint32_t x32 = x & 0xFFFF;
        while (i < container->n_runs) {
            uint32_t startpoint = container->runs[i].value;
            uint32_t length = container->runs[i].length;
            uint32_t endpoint = length + startpoint;
            if (x32 <= endpoint) {
                if (x32 < startpoint) {
                    *(ans++) = start_rank + sum;
                } else {
                    *(ans++) = start_rank + sum + (x32 - startpoint) + 1;
                }
                break;
            } else {
                sum += length + 1;
                i++;
            }
        }
        if (i >= container->n_runs) *(ans++) = start_rank + sum;
    }

    return iter - begin;
}